

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O1

void __thiscall
QGestureManager::getGestureTargets
          (QGestureManager *this,QSet<QGesture_*> *gestures,
          QHash<QWidget_*,_QList<QGesture_*>_> *conflicts,
          QHash<QWidget_*,_QList<QGesture_*>_> *normal)

{
  Span **ppSVar1;
  byte bVar2;
  long lVar3;
  Entry *pEVar4;
  bool bVar5;
  GestureType GVar6;
  const_iterator cVar7;
  ulong uVar8;
  Data *pDVar9;
  QWidget *pQVar10;
  long lVar11;
  const_iterator cVar12;
  long lVar13;
  ulong uVar14;
  QObject *pQVar15;
  QPodArrayOps<QGesture*> *pQVar16;
  ulong uVar17;
  long lVar18;
  Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *pDVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  QWidget *widget;
  QGesture *gesture;
  QWidget *local_78;
  undefined8 uStack_70;
  QPointer<QWidget> local_60;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.wp.value = (QObject *)0x0;
  pDVar9 = (gestures->q_hash).d;
  if (pDVar9 == (Data *)0x0) {
    pDVar9 = (Data *)0x0;
LAB_002d788e:
    uVar17 = 0;
  }
  else {
    if (pDVar9->spans->offsets[0] != 0xff) goto LAB_002d788e;
    uVar14 = 1;
    do {
      uVar17 = uVar14;
      if (pDVar9->numBuckets == uVar17) {
        pDVar9 = (Data *)0x0;
        uVar17 = 0;
        break;
      }
      uVar14 = uVar17 + 1;
    } while (pDVar9->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
  }
  if (uVar17 != 0 || pDVar9 != (Data *)0x0) {
    do {
      local_60.wp.d =
           *(Data **)pDVar9->spans[uVar17 >> 7].entries
                     [pDVar9->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f]].storage.data;
      local_78 = (QWidget *)0x0;
      uStack_70 = 0;
      QHash<QGesture_*,_QPointer<QWidget>_>::value
                ((QHash<QGesture_*,_QPointer<QWidget>_> *)&local_50,(QGesture **)(this + 0x40),
                 &local_60);
      if ((local_50.iterator.i.d == (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0)
         || (pDVar19 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)
                       local_50.iterator.i.bucket, *(int *)&(local_50.iterator.i.d)->field_0x4 == 0)
         ) {
        pDVar19 = (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0;
      }
      if (local_50.iterator.i.d != (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0)
      {
        LOCK();
        ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) &&
           (local_50.iterator.i.d != (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0
           )) {
          operator_delete(local_50.iterator.i.d);
        }
      }
      if (local_78 != (QWidget *)0x0) {
        LOCK();
        *(int *)local_78 = *(int *)local_78 + -1;
        UNLOCK();
        if ((*(int *)local_78 == 0) && (local_78 != (QWidget *)0x0)) {
          operator_delete(local_78);
        }
      }
      if (pDVar19 != (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0) {
        GVar6 = QGesture::gestureType((QGesture *)local_60.wp.d);
        local_78 = (QWidget *)CONCAT44(local_78._4_4_,GVar6);
        QHash<Qt::GestureType,QHash<QWidget*,QGesture*>>::tryEmplace_impl<Qt::GestureType_const&>
                  ((TryEmplaceResult *)&local_50,&local_60.wp.value,(GestureType *)&local_78);
        ppSVar1 = &(local_50.iterator.i.d)->spans;
        local_50.iterator.i.d = pDVar19;
        QHash<QWidget*,QGesture*>::emplace<QGesture*const&>
                  ((QHash<QWidget*,QGesture*> *)
                   ((((*ppSVar1)[local_50.iterator.i.bucket >> 7].entries)->storage).data +
                   (ulong)(*ppSVar1)[local_50.iterator.i.bucket >> 7].offsets
                          [(uint)local_50.iterator.i.bucket & 0x7f] * 0x10 + 8),
                   (QWidget **)&local_50,(QGesture **)&local_60);
      }
      do {
        if (pDVar9->numBuckets - 1 == uVar17) {
          uVar17 = 0;
          pDVar9 = (Data *)0x0;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (pDVar9->spans[uVar17 >> 7].offsets[(uint)uVar17 & 0x7f] == 0xff);
    } while (uVar17 != 0 || pDVar9 != (Data *)0x0);
  }
  if (local_60.wp.value == (QObject *)0x0) {
    pQVar15 = (QObject *)0x0;
  }
  else {
    pQVar15 = local_60.wp.value;
    if (**(char **)(local_60.wp.value + 0x20) == -1) {
      uVar17 = 1;
      do {
        uVar14 = uVar17;
        if (*(ulong *)(local_60.wp.value + 0x10) == uVar14) {
          uVar14 = 0;
          pQVar15 = (QObject *)0x0;
          break;
        }
        uVar17 = uVar14 + 1;
      } while ((*(char **)(local_60.wp.value + 0x20))
               [(ulong)((uint)uVar14 & 0x7f) + (uVar14 >> 7) * 0x90] == -1);
      goto LAB_002d7a56;
    }
  }
  uVar14 = 0;
LAB_002d7a56:
  if (pQVar15 != (QObject *)0x0 || uVar14 != 0) {
    do {
      lVar18 = (uVar14 >> 7) * 0x90;
      uVar17 = (ulong)((uint)uVar14 & 0x7f);
      lVar13 = *(long *)(*(long *)(*(long *)(pQVar15 + 0x20) + 0x80 + lVar18) + 8 +
                        (ulong)*(byte *)(uVar17 + *(long *)(pQVar15 + 0x20) + lVar18) * 0x10);
      if (lVar13 == 0) {
LAB_002d7ae5:
        lVar13 = 0;
LAB_002d7ae7:
        uVar20 = 0;
      }
      else {
        if (**(char **)(lVar13 + 0x20) != -1) goto LAB_002d7ae7;
        uVar8 = 1;
        do {
          uVar20 = uVar8;
          if (*(ulong *)(lVar13 + 0x10) == uVar20) goto LAB_002d7ae5;
          uVar8 = uVar20 + 1;
        } while ((*(char **)(lVar13 + 0x20))[(ulong)((uint)uVar20 & 0x7f) + (uVar20 >> 7) * 0x90] ==
                 -1);
      }
      if (lVar13 != 0 || uVar20 != 0) {
        do {
          lVar11 = (uVar20 >> 7) * 0x90;
          uVar8 = (ulong)((uint)uVar20 & 0x7f);
          local_78 = *(QWidget **)
                      (*(long *)(*(long *)(lVar13 + 0x20) + 0x80 + lVar11) +
                      (ulong)*(byte *)(uVar8 + *(long *)(lVar13 + 0x20) + lVar11) * 0x10);
          pQVar10 = *(QWidget **)(*(long *)&local_78->field_0x8 + 0x10);
          do {
            if (pQVar10 == (QWidget *)0x0) {
              pQVar10 = (QWidget *)0x0;
              break;
            }
            cVar7 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
                              ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                               (*(long *)&pQVar10->field_0x8 + 0x238),
                               (GestureType *)
                               ((ulong)*(byte *)(uVar17 + *(long *)(pQVar15 + 0x20) + lVar18) * 0x10
                               + *(long *)(*(long *)(pQVar15 + 0x20) + 0x80 + lVar18)));
            lVar3 = *(long *)(*(long *)&pQVar10->field_0x8 + 0x238);
            cVar12._M_node = (_Base_ptr)(lVar3 + 0x10);
            if (lVar3 == 0) {
              cVar12._M_node = (_Base_ptr)0x0;
            }
            if (((cVar7.i._M_node == (const_iterator)cVar12._M_node) ||
                ((*(byte *)((long)cVar7.i._M_node + 0x24) & 1) != 0)) || (pQVar10 == local_78)) {
              if (((pQVar10->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
                pQVar10 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10);
                bVar5 = true;
              }
              else {
                bVar5 = false;
                pQVar10 = (QWidget *)0x0;
              }
            }
            else {
              QHash<QWidget*,QList<QGesture*>>::tryEmplace_impl<QWidget*const&>
                        (&local_50,conflicts,&local_78);
              pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
              bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                      [(uint)local_50.iterator.i.bucket & 0x7f];
              pQVar16 = (QPodArrayOps<QGesture*> *)(pEVar4[bVar2].storage.data + 8);
              local_50.iterator.i.d =
                   *(Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> **)
                    (*(long *)(*(long *)(lVar13 + 0x20) + 0x80 + lVar11) + 8 +
                    (ulong)*(byte *)(uVar8 + *(long *)(lVar13 + 0x20) + lVar11) * 0x10);
              QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                        (pQVar16,*(qsizetype *)(pEVar4[bVar2].storage.data + 0x18),
                         (QGesture **)&local_50);
              QList<QGesture_*>::end((QList<QGesture_*> *)pQVar16);
              bVar5 = false;
            }
          } while (bVar5);
          if (pQVar10 == (QWidget *)0x0) {
            QHash<QWidget*,QList<QGesture*>>::tryEmplace_impl<QWidget*const&>
                      (&local_50,normal,&local_78);
            pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
            bVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                    [(uint)local_50.iterator.i.bucket & 0x7f];
            pQVar16 = (QPodArrayOps<QGesture*> *)(pEVar4[bVar2].storage.data + 8);
            local_50.iterator.i.d =
                 *(Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> **)
                  (*(long *)(*(long *)(lVar13 + 0x20) + 0x80 + lVar11) + 8 +
                  (ulong)*(byte *)(uVar8 + *(long *)(lVar13 + 0x20) + lVar11) * 0x10);
            QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                      (pQVar16,*(qsizetype *)(pEVar4[bVar2].storage.data + 0x18),
                       (QGesture **)&local_50);
            QList<QGesture_*>::end((QList<QGesture_*> *)pQVar16);
          }
          do {
            if (*(long *)(lVar13 + 0x10) - 1U == uVar20) {
              lVar13 = 0;
              uVar20 = 0;
              break;
            }
            uVar20 = uVar20 + 1;
          } while (*(char *)((ulong)((uint)uVar20 & 0x7f) +
                            (uVar20 >> 7) * 0x90 + *(long *)(lVar13 + 0x20)) == -1);
        } while ((lVar13 != 0) || (uVar20 != 0));
      }
      do {
        if (*(long *)(pQVar15 + 0x10) - 1U == uVar14) {
          pQVar15 = (QObject *)0x0;
          uVar14 = 0;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (*(char *)((ulong)((uint)uVar14 & 0x7f) +
                        (uVar14 >> 7) * 0x90 + *(long *)(pQVar15 + 0x20)) == -1);
    } while ((pQVar15 != (QObject *)0x0) || (uVar14 != 0));
  }
  QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::~QHash
            ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)&local_60.wp.value);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGestureManager::getGestureTargets(const QSet<QGesture*> &gestures,
    QHash<QWidget *, QList<QGesture *> > *conflicts,
    QHash<QWidget *, QList<QGesture *> > *normal)
{
    typedef QHash<Qt::GestureType, QHash<QWidget *, QGesture *> > GestureByTypes;
    GestureByTypes gestureByTypes;

    // sort gestures by types
    for (QGesture *gesture : gestures) {
        QWidget *receiver = m_gestureTargets.value(gesture, nullptr);
        Q_ASSERT(receiver);
        if (receiver)
            gestureByTypes[gesture->gestureType()].insert(receiver, gesture);
    }

    // for each gesture type
    for (GestureByTypes::const_iterator git = gestureByTypes.cbegin(), gend = gestureByTypes.cend(); git != gend; ++git) {
        const QHash<QWidget *, QGesture *> &gestures = git.value();
        for (QHash<QWidget *, QGesture *>::const_iterator wit = gestures.cbegin(), wend = gestures.cend(); wit != wend; ++wit) {
            QWidget *widget = wit.key();
            QWidget *w = widget->parentWidget();
            while (w) {
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it
                        = w->d_func()->gestureContext.constFind(git.key());
                if (it != w->d_func()->gestureContext.constEnd()) {
                    // i.e. 'w' listens to gesture 'type'
                    if (!(it.value() & Qt::DontStartGestureOnChildren) && w != widget) {
                        // conflicting gesture!
                        (*conflicts)[widget].append(wit.value());
                        break;
                    }
                }
                if (w->isWindow()) {
                    w = nullptr;
                    break;
                }
                w = w->parentWidget();
            }
            if (!w)
                (*normal)[widget].append(wit.value());
        }
    }
}